

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

S1Angle S2LatLngRect::GetDirectedHausdorffDistance(double lng_diff,R1Interval *a,R1Interval *b)

{
  bool bVar1;
  ostream *poVar2;
  S1Angle *pSVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double local_1a8;
  R1Interval local_1a0;
  S1Angle local_190;
  double local_188;
  R1Interval local_180;
  S1Angle local_170;
  S1Angle local_168;
  S1Angle local_160;
  double local_158;
  double p_lat;
  S2Point *local_138;
  S2Point *p;
  S1Angle local_128;
  double local_120;
  R2Point local_118;
  undefined1 local_108 [8];
  S2Point a_hi;
  undefined1 local_e0 [8];
  S2Point a_lo;
  undefined1 local_b8 [8];
  S2Point b_hi;
  undefined1 local_90 [8];
  S2Point b_lo;
  double b_lng;
  S2LogMessage local_68;
  S2LogMessageVoidify local_55 [20];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  R1Interval *local_28;
  R1Interval *b_local;
  R1Interval *a_local;
  double lng_diff_local;
  S1Angle max_distance;
  
  local_41 = 0;
  local_28 = b;
  b_local = a;
  a_local = (R1Interval *)lng_diff;
  if (lng_diff < 0.0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x26b,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar2 = S2LogMessage::stream(&local_40);
    poVar2 = std::operator<<(poVar2,"Check failed: (lng_diff) >= (0) ");
    S2LogMessageVoidify::operator&(&local_29,poVar2);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  if (3.141592653589793 < (double)a_local) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng_rect.cc"
               ,0x26c,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_68);
    poVar2 = std::operator<<(poVar2,"Check failed: (lng_diff) <= (3.14159265358979323846) ");
    S2LogMessageVoidify::operator&(local_55,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
  }
  if (((double)a_local != 0.0) || (NAN((double)a_local))) {
    b_lo.c_[2] = (VType)a_local;
    dVar5 = R1Interval::lo(local_28);
    join_0x00001240_0x00001200_ = (VType  [2])S2LatLng::FromRadians(dVar5,b_lo.c_[2]);
    S2LatLng::ToPoint((S2Point *)local_90,(S2LatLng *)(b_hi.c_ + 2));
    dVar5 = R1Interval::hi(local_28);
    join_0x00001240_0x00001200_ = (VType  [2])S2LatLng::FromRadians(dVar5,b_lo.c_[2]);
    S2LatLng::ToPoint((S2Point *)local_b8,(S2LatLng *)(a_lo.c_ + 2));
    S1Angle::S1Angle((S1Angle *)&lng_diff_local);
    dVar5 = R1Interval::lo(b_local);
    join_0x00001240_0x00001200_ = (VType  [2])S2LatLng::FromRadians(dVar5,0.0);
    S2LatLng::ToPoint((S2Point *)local_e0,(S2LatLng *)(a_hi.c_ + 2));
    dVar5 = R1Interval::hi(b_local);
    local_118.c_ = (VType  [2])S2LatLng::FromRadians(dVar5,0.0);
    S2LatLng::ToPoint((S2Point *)local_108,(S2LatLng *)&local_118);
    local_120 = (double)S2::GetDistance((S2Point *)local_e0,(S2Point *)local_90,(S2Point *)local_b8)
    ;
    lng_diff_local = local_120;
    local_128 = S2::GetDistance((S2Point *)local_108,(S2Point *)local_90,(S2Point *)local_b8);
    pSVar3 = std::max<S1Angle>((S1Angle *)&lng_diff_local,&local_128);
    lng_diff_local = pSVar3->radians_;
    if (1.5707963267948966 < (double)a_local) {
      GetBisectorIntersection((S2Point *)&p_lat,local_28,b_lo.c_[2]);
      local_138 = (S2Point *)&p_lat;
      local_160 = S2LatLng::Latitude(local_138);
      local_158 = S1Angle::radians(&local_160);
      bVar1 = R1Interval::Contains(b_local,local_158);
      if (bVar1) {
        S1Angle::S1Angle(&local_168,local_138,(S2Point *)local_90);
        pSVar3 = std::max<S1Angle>((S1Angle *)&lng_diff_local,&local_168);
        lng_diff_local = pSVar3->radians_;
      }
      dVar5 = local_158;
      dVar6 = R1Interval::lo(b_local);
      if (dVar6 < dVar5) {
        dVar5 = R1Interval::lo(b_local);
        local_188 = R1Interval::hi(b_local);
        pdVar4 = std::min<double>(&local_158,&local_188);
        R1Interval::R1Interval(&local_180,dVar5,*pdVar4);
        local_170 = GetInteriorMaxDistance(&local_180,(S2Point *)local_90);
        pSVar3 = std::max<S1Angle>((S1Angle *)&lng_diff_local,&local_170);
        lng_diff_local = pSVar3->radians_;
      }
      dVar5 = local_158;
      dVar6 = R1Interval::hi(b_local);
      if (dVar5 < dVar6) {
        local_1a8 = R1Interval::lo(b_local);
        pdVar4 = std::max<double>(&local_158,&local_1a8);
        dVar5 = *pdVar4;
        dVar6 = R1Interval::hi(b_local);
        R1Interval::R1Interval(&local_1a0,dVar5,dVar6);
        local_190 = GetInteriorMaxDistance(&local_1a0,(S2Point *)local_b8);
        pSVar3 = std::max<S1Angle>((S1Angle *)&lng_diff_local,&local_190);
        lng_diff_local = pSVar3->radians_;
      }
    }
    else {
      bVar1 = R1Interval::Contains(b_local,0.0);
      if ((bVar1) && (bVar1 = R1Interval::Contains(local_28,0.0), bVar1)) {
        p = (S2Point *)S1Angle::Radians((double)a_local);
        pSVar3 = std::max<S1Angle>((S1Angle *)&lng_diff_local,(S1Angle *)&p);
        lng_diff_local = pSVar3->radians_;
      }
    }
  }
  else {
    dVar5 = R1Interval::GetDirectedHausdorffDistance(b_local,local_28);
    lng_diff_local = (double)S1Angle::Radians(dVar5);
  }
  return (S1Angle)lng_diff_local;
}

Assistant:

S1Angle S2LatLngRect::GetDirectedHausdorffDistance(
    double lng_diff, const R1Interval& a, const R1Interval& b) {
  // By symmetry, we can assume a's longtitude is 0 and b's longtitude is
  // lng_diff. Call b's two endpoints b_lo and b_hi. Let H be the hemisphere
  // containing a and delimited by the longitude line of b. The Voronoi diagram
  // of b on H has three edges (portions of great circles) all orthogonal to b
  // and meeting at b_lo cross b_hi.
  // E1: (b_lo, b_lo cross b_hi)
  // E2: (b_hi, b_lo cross b_hi)
  // E3: (-b_mid, b_lo cross b_hi), where b_mid is the midpoint of b
  //
  // They subdivide H into three Voronoi regions. Depending on how longitude 0
  // (which contains edge a) intersects these regions, we distinguish two cases:
  // Case 1: it intersects three regions. This occurs when lng_diff <= M_PI_2.
  // Case 2: it intersects only two regions. This occurs when lng_diff > M_PI_2.
  //
  // In the first case, the directed Hausdorff distance to edge b can only be
  // realized by the following points on a:
  // A1: two endpoints of a.
  // A2: intersection of a with the equator, if b also intersects the equator.
  //
  // In the second case, the directed Hausdorff distance to edge b can only be
  // realized by the following points on a:
  // B1: two endpoints of a.
  // B2: intersection of a with E3
  // B3: farthest point from b_lo to the interior of D, and farthest point from
  //     b_hi to the interior of U, if any, where D (resp. U) is the portion
  //     of edge a below (resp. above) the intersection point from B2.

  S2_DCHECK_GE(lng_diff, 0);
  S2_DCHECK_LE(lng_diff, M_PI);

  if (lng_diff == 0) {
    return S1Angle::Radians(a.GetDirectedHausdorffDistance(b));
  }

  // Assumed longtitude of b.
  double b_lng = lng_diff;
  // Two endpoints of b.
  S2Point b_lo = S2LatLng::FromRadians(b.lo(), b_lng).ToPoint();
  S2Point b_hi = S2LatLng::FromRadians(b.hi(), b_lng).ToPoint();

  // Handling of each case outlined at the top of the function starts here.
  // This is initialized a few lines below.
  S1Angle max_distance;

  // Cases A1 and B1.
  S2Point a_lo = S2LatLng::FromRadians(a.lo(), 0).ToPoint();
  S2Point a_hi = S2LatLng::FromRadians(a.hi(), 0).ToPoint();
  max_distance = S2::GetDistance(a_lo, b_lo, b_hi);
  max_distance = max(
      max_distance, S2::GetDistance(a_hi, b_lo, b_hi));

  if (lng_diff <= M_PI_2) {
    // Case A2.
    if (a.Contains(0) && b.Contains(0)) {
      max_distance = max(max_distance, S1Angle::Radians(lng_diff));
    }
  } else {
    // Case B2.
    const S2Point& p = GetBisectorIntersection(b, b_lng);
    double p_lat = S2LatLng::Latitude(p).radians();
    if (a.Contains(p_lat)) {
      max_distance = max(max_distance, S1Angle(p, b_lo));
    }

    // Case B3.
    if (p_lat > a.lo()) {
      max_distance = max(max_distance, GetInteriorMaxDistance(
          R1Interval(a.lo(), min(p_lat, a.hi())), b_lo));
    }
    if (p_lat < a.hi()) {
      max_distance = max(max_distance, GetInteriorMaxDistance(
          R1Interval(max(p_lat, a.lo()), a.hi()), b_hi));
    }
  }

  return max_distance;
}